

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

bool __thiscall crnlib::crn_comp::alias_images(crn_comp *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  crn_uint32 cVar7;
  uint uVar8;
  crn_comp_params *pcVar9;
  color_quad<unsigned_char,_int> *p;
  conversion_type conv_type;
  color_quad<unsigned_char,_int> *pcVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint *puVar15;
  uint uVar16;
  image<crnlib::color_quad<unsigned_char,_int>_> *other;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  pixel_buf_t *ppVar21;
  bool bVar22;
  bool bVar23;
  image_u8 cooked_image;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_80;
  image<crnlib::color_quad<unsigned_char,_int>_> local_70;
  long local_40;
  pixel_buf_t *local_38;
  
  bVar22 = this->m_pParams->m_faces == 0;
  if (!bVar22) {
    local_38 = &this->m_images[0][0].m_pixel_buf;
    local_40 = 0x30;
    local_80 = (image<crnlib::color_quad<unsigned_char,_int>_> *)0x0;
    do {
      pcVar9 = this->m_pParams;
      bVar23 = pcVar9->m_levels != 0;
      if (bVar23) {
        pcVar10 = (color_quad<unsigned_char,_int> *)pcVar9->m_pImages[(long)local_80][0];
        if (pcVar10 != (color_quad<unsigned_char,_int> *)0x0) {
          uVar16 = pcVar9->m_height + (uint)(pcVar9->m_height == 0);
          uVar17 = pcVar9->m_width + (uint)(pcVar9->m_width == 0);
          uVar20 = 1;
          lVar12 = local_40;
          ppVar21 = local_38;
          do {
            if (ppVar21->m_p != (color_quad<unsigned_char,_int> *)0x0) {
              crnlib_free(ppVar21->m_p);
              ppVar21->m_p = (color_quad<unsigned_char,_int> *)0x0;
              ppVar21->m_size = 0;
              ppVar21->m_capacity = 0;
            }
            *(color_quad<unsigned_char,_int> **)((long)(ppVar21 + -1) + 8) = pcVar10;
            ((image_u8 *)(ppVar21 + -2))->m_width = uVar17;
            ((image_u8 *)(ppVar21 + -2))->m_height = uVar16;
            ((image_u8 *)(ppVar21 + -2))->m_pitch = uVar17;
            ((image_u8 *)(ppVar21 + -2))->m_total = uVar16 * uVar17;
            *(uint *)(ppVar21 + -1) = 0xf;
            pcVar9 = this->m_pParams;
            bVar23 = uVar20 < pcVar9->m_levels;
            if (!bVar23) goto LAB_001659c1;
            uVar18 = pcVar9->m_width >> ((byte)uVar20 & 0x1f);
            uVar17 = uVar18 + (uVar18 == 0);
            uVar18 = pcVar9->m_height >> ((byte)uVar20 & 0x1f);
            uVar16 = uVar18 + (uVar18 == 0);
            pcVar10 = *(color_quad<unsigned_char,_int> **)
                       ((long)(pcVar9->m_pImages + -1) + 0x58 + lVar12);
            ppVar21 = ppVar21 + 3;
            uVar20 = uVar20 + 1;
            lVar12 = lVar12 + 8;
          } while (pcVar10 != (color_quad<unsigned_char,_int> *)0x0);
        }
        if (bVar23) {
          if (bVar22 == false) {
            return false;
          }
          break;
        }
      }
LAB_001659c1:
      local_80 = (image<crnlib::color_quad<unsigned_char,_int>_> *)((long)local_80 + 1);
      local_38 = local_38 + 0x30;
      local_40 = local_40 + 0x80;
      bVar23 = local_80 < (ulong)this->m_pParams->m_faces;
      bVar22 = !bVar23;
    } while (bVar23);
  }
  conv_type = image_utils::get_image_conversion_type_from_crn_format(this->m_pParams->m_format);
  if ((conv_type != cConversion_Invalid) && (this->m_pParams->m_faces != 0)) {
    local_80 = this->m_images[0];
    uVar13 = 0;
    do {
      if (this->m_pParams->m_levels != 0) {
        uVar19 = 0;
        other = local_80;
        do {
          image<crnlib::color_quad<unsigned_char,_int>_>::image(&local_70,other);
          image_utils::convert_image(&local_70,conv_type);
          uVar16 = other->m_width;
          other->m_width = local_70.m_width;
          uVar17 = other->m_height;
          other->m_height = local_70.m_height;
          uVar1 = other->m_pitch;
          other->m_pitch = local_70.m_pitch;
          uVar2 = other->m_total;
          other->m_total = local_70.m_total;
          uVar3 = other->m_comp_flags;
          other->m_comp_flags = local_70.m_comp_flags;
          pcVar10 = other->m_pPixels;
          other->m_pPixels = local_70.m_pPixels;
          p = (other->m_pixel_buf).m_p;
          (other->m_pixel_buf).m_p = local_70.m_pixel_buf.m_p;
          uVar4 = (other->m_pixel_buf).m_size;
          (other->m_pixel_buf).m_size = local_70.m_pixel_buf.m_size;
          uVar5 = (other->m_pixel_buf).m_capacity;
          (other->m_pixel_buf).m_capacity = local_70.m_pixel_buf.m_capacity;
          local_70.m_width = uVar16;
          local_70.m_height = uVar17;
          local_70.m_pitch = uVar1;
          local_70.m_total = uVar2;
          local_70.m_comp_flags = uVar3;
          local_70.m_pPixels = pcVar10;
          local_70.m_pixel_buf.m_p = p;
          local_70.m_pixel_buf.m_size = uVar4;
          local_70.m_pixel_buf.m_capacity = uVar5;
          if (p != (color_quad<unsigned_char,_int> *)0x0) {
            crnlib_free(p);
          }
          uVar19 = uVar19 + 1;
          other = other + 1;
        } while (uVar19 < this->m_pParams->m_levels);
      }
      uVar13 = uVar13 + 1;
      local_80 = local_80 + 0x10;
    } while (uVar13 < this->m_pParams->m_faces);
  }
  uVar20 = this->m_pParams->m_levels;
  uVar18 = (this->m_levels).m_size;
  if (uVar18 != uVar20) {
    if ((uVar18 <= uVar20) && ((this->m_levels).m_capacity < uVar20)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_levels,uVar20,uVar18 + 1 == uVar20,0xc,
                 (object_mover)0x0,false);
    }
    (this->m_levels).m_size = uVar20;
  }
  this->m_total_blocks = 0;
  pcVar9 = this->m_pParams;
  uVar20 = pcVar9->m_levels;
  if ((ulong)uVar20 != 0) {
    uVar18 = this->m_total_blocks;
    uVar6 = pcVar9->m_height;
    cVar7 = pcVar9->m_faces;
    uVar8 = pcVar9->m_width;
    bVar23 = this->m_has_subblocks;
    puVar15 = &((this->m_levels).m_p)->block_width;
    uVar13 = 0;
    do {
      uVar14 = uVar6 >> ((byte)uVar13 & 0x1f);
      uVar11 = uVar8 >> ((byte)uVar13 & 0x1f);
      uVar11 = (uVar11 + 7 + (uint)(uVar11 == 0) & 0xfffffff8) >> (2U - bVar23 & 0x1f);
      *puVar15 = uVar11;
      ((level_details *)(puVar15 + -2))->first_block = uVar18;
      uVar11 = (uVar14 + 7 + (uint)(uVar14 == 0) >> 2 & 0xfffffffe) * cVar7 * uVar11;
      puVar15[-1] = uVar11;
      uVar18 = uVar11 + uVar18;
      uVar13 = uVar13 + 1;
      puVar15 = puVar15 + 3;
    } while (uVar20 != uVar13);
    this->m_total_blocks = uVar18;
  }
  return bVar22;
}

Assistant:

bool crn_comp::alias_images()
    {
        for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
        {
            for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
            {
                const uint width = math::maximum(1U, m_pParams->m_width >> level_index);
                const uint height = math::maximum(1U, m_pParams->m_height >> level_index);
                if (!m_pParams->m_pImages[face_index][level_index])
                {
                    return false;
                }
                m_images[face_index][level_index].alias((color_quad_u8*)m_pParams->m_pImages[face_index][level_index], width, height);
            }
        }

        image_utils::conversion_type conv_type = image_utils::get_image_conversion_type_from_crn_format((crn_format)m_pParams->m_format);
        if (conv_type != image_utils::cConversion_Invalid)
        {
            for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
            {
                for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
                {
                    image_u8 cooked_image(m_images[face_index][level_index]);
                    image_utils::convert_image(cooked_image, conv_type);
                    m_images[face_index][level_index].swap(cooked_image);
                }
            }
        }

        m_levels.resize(m_pParams->m_levels);
        m_total_blocks = 0;
        for (uint level = 0; level < m_pParams->m_levels; level++)
        {
            uint blockHeight = ((math::maximum(1U, m_pParams->m_height >> level) + 7) & ~7) >> 2;
            m_levels[level].block_width = ((math::maximum(1U, m_pParams->m_width >> level) + 7) & ~7) >> (m_has_subblocks ? 1 : 2);
            m_levels[level].first_block = m_total_blocks;
            m_levels[level].num_blocks = m_pParams->m_faces * m_levels[level].block_width * blockHeight;
            m_total_blocks += m_levels[level].num_blocks;
        }

        return true;
    }